

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_watcher.hpp
# Opt level: O0

void __thiscall
vfs::posix_watcher::posix_watcher(posix_watcher *this,path *dir,callback_t *callback)

{
  unsigned_long uVar1;
  callback_t *callback_local;
  path *dir_local;
  posix_watcher *this_local;
  
  std::atomic<bool>::atomic(&this->running_,false);
  path::path(&this->dir_,dir);
  this->inotifyFd_ = -1;
  std::function<void_(const_vfs::path_&)>::function(&this->callback_,callback);
  std::thread::thread(&this->thread_);
  std::condition_variable::condition_variable(&this->cv_);
  std::mutex::mutex(&this->cvMutex_);
  uVar1 = std::numeric_limits<unsigned_long>::max();
  this->waitTimeoutInMs_ = uVar1;
  return;
}

Assistant:

posix_watcher(const path &dir, const callback_t &callback)
            : running_(false)
            , dir_(dir)
            , callback_(callback)
            , inotifyFd_(-1)
            , waitTimeoutInMs_(std::numeric_limits<uint64_t>::max())
        {}